

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

void __thiscall
capnp::JsonCodec::addFieldHandlerImpl(JsonCodec *this,Field field,Type type,HandlerBase *handler)

{
  HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*> *table;
  RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
  **ppRVar1;
  Impl *pIVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  bool bVar5;
  long lVar6;
  size_t newSize;
  DebugComparison<capnp::Type_&,_capnp::Type> *pDVar7;
  RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
  *pRVar8;
  byte bVar9;
  Fault FStack_b8;
  Fault f;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_a8;
  DebugComparison<capnp::Type_&,_capnp::Type> _kjCondition;
  HandlerBase *local_40;
  Type type_local;
  
  type_local.field_4 = type.field_4;
  type_local._0_8_ = type._0_8_;
  bVar9 = 0;
  _f = StructSchema::Field::getType(&field);
  bVar5 = Type::operator==(&type_local,(Type *)&f);
  _kjCondition.right._0_8_ = f.exception;
  _kjCondition.right.field_4.schema = aStack_a8.schema;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = bVar5;
  if (!bVar5) {
    _kjCondition.left = &type_local;
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::Type&,capnp::Type>&,char_const(&)[60]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
               ,900,FAILED,"type == field.getType()",
               "_kjCondition,\"handler type did not match field type for addFieldHandler()\"",
               &_kjCondition,
               (char (*) [60])"handler type did not match field type for addFieldHandler()");
    kj::_::Debug::Fault::fatal(&f);
  }
  pIVar2 = (this->impl).ptr;
  _kjCondition.op.content.size_ = (size_t)field.proto._reader.data;
  _kjCondition._40_8_ = field.proto._reader.pointers;
  _kjCondition.right.field_4.schema = (RawBrandedSchema *)field.proto._reader.segment;
  _kjCondition.op.content.ptr = (char *)field.proto._reader.capTable;
  _kjCondition.left = (Type *)field.parent.super_Schema.raw;
  _kjCondition.right._0_8_ = field._8_8_;
  table = &pIVar2->fieldHandlers;
  kj::
  Table<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  ::Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&f,&table->table,
             ((long)(pIVar2->fieldHandlers).table.rows.builder.pos -
              (long)(pIVar2->fieldHandlers).table.rows.builder.ptr >> 3) * -0x71c71c71c71c71c7,
             (Entry *)&_kjCondition,0xffffffff);
  if ((char)f.exception == '\x01') {
    f.exception = (Exception *)&(table->table).rows.builder.ptr[aStack_a8.scopeId].value;
    aStack_a8.schema = (RawBrandedSchema *)&local_40;
    if (*(HandlerBase **)f.exception != handler) {
      local_40 = handler;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::JsonCodec::HandlerBase*&,capnp::JsonCodec::HandlerBase*&>&,char_const(&)[49]>
                (&FStack_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x386,FAILED,"existing == replacement",
                 "_kjCondition,\"field already has a different registered handler\"",
                 (DebugComparison<capnp::JsonCodec::HandlerBase_*&,_capnp::JsonCodec::HandlerBase_*&>
                  *)&f,(char (*) [49])"field already has a different registered handler");
      kj::_::Debug::Fault::fatal(&FStack_b8);
    }
  }
  else {
    pEVar3 = (pIVar2->fieldHandlers).table.rows.builder.endPtr;
    if ((pIVar2->fieldHandlers).table.rows.builder.pos == pEVar3) {
      pEVar4 = (table->table).rows.builder.ptr;
      newSize = 4;
      if (pEVar3 != pEVar4) {
        newSize = ((long)pEVar3 - (long)pEVar4 >> 3) * 0x1c71c71c71c71c72;
      }
      kj::Vector<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>::
      setCapacity((Vector<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                   *)table,newSize);
    }
    pDVar7 = &_kjCondition;
    pRVar8 = (pIVar2->fieldHandlers).table.rows.builder.pos;
    for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pRVar8->key).parent.super_Schema.raw = (RawBrandedSchema *)pDVar7->left;
      pDVar7 = (DebugComparison<capnp::Type_&,_capnp::Type> *)
               ((long)pDVar7 + (ulong)bVar9 * -0x10 + 8);
      pRVar8 = (RemoveConst<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry>
                *)((long)pRVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    ppRVar1 = &(pIVar2->fieldHandlers).table.rows.builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
  }
  return;
}

Assistant:

void JsonCodec::addFieldHandlerImpl(StructSchema::Field field, Type type, HandlerBase& handler) {
  KJ_REQUIRE(type == field.getType(),
      "handler type did not match field type for addFieldHandler()");
  impl->fieldHandlers.upsert(field, &handler, [](HandlerBase*& existing, HandlerBase* replacement) {
    KJ_REQUIRE(existing == replacement, "field already has a different registered handler");
  });
}